

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlcxx2_html.hpp
# Opt level: O2

void __thiscall
htmlcxx2::HTML::ParserSax::parseContent<char_const*>(ParserSax *this,char *begin,char *pos)

{
  string text;
  Node node;
  allocator<char> local_11a;
  allocator<char> local_119;
  string local_118;
  string local_f8;
  string local_d8;
  Node local_b8;
  
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"",&local_119);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"",&local_11a);
  Node::Node(&local_b8,&local_d8,&local_118,&local_f8,this->currentOffset_,
             local_118._M_string_length,NODE_TEXT);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_d8);
  this->currentOffset_ = this->currentOffset_ + local_b8.length_;
  (*this->_vptr_ParserSax[4])(this);
  Node::~Node(&local_b8);
  std::__cxx11::string::~string((string *)&local_118);
  return;
}

Assistant:

void ParserSax::parseContent(It begin, It pos)
{
    std::string text(begin, pos);
    Node node("", text, "", currentOffset_, text.length(), Node::NODE_TEXT);
    currentOffset_ += node.length();
    onFoundText(node);
}